

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_checkstack(lua_State *L,int size)

{
  uint in_ESI;
  long in_RDI;
  MSize in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int local_10;
  
  if (((int)in_ESI < 0x1f41) &&
     ((*(long *)(in_RDI + 0x18) - *(long *)(in_RDI + 0x10) >> 3) + (long)(int)in_ESI < 0x1f41)) {
    if ((0 < (int)in_ESI) &&
       ((long)((ulong)*(uint *)(in_RDI + 0x20) - *(long *)(in_RDI + 0x18)) <=
        (long)((ulong)in_ESI * 8))) {
      lj_state_growstack((lua_State *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),
                         in_stack_ffffffffffffffdc);
    }
    local_10 = 1;
  }
  else {
    local_10 = 0;
  }
  return local_10;
}

Assistant:

LUA_API int lua_checkstack(lua_State *L, int size)
{
  if (size > LUAI_MAXCSTACK || (L->top - L->base + size) > LUAI_MAXCSTACK) {
    return 0;  /* Stack overflow. */
  } else if (size > 0) {
    lj_state_checkstack(L, (MSize)size);
  }
  return 1;
}